

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Performance::anon_unknown_1::
RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>::init
          (RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
           *this,EVP_PKEY_CTX *ctx)

{
  deUint64 *pdVar1;
  RenderUploadRenderReadDuration *pRVar2;
  RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
  *pRVar3;
  pointer this_00;
  int iVar4;
  int extraout_EAX;
  undefined4 extraout_var;
  RenderTarget *pRVar5;
  ulong uVar6;
  ulong uVar7;
  pointer pSVar8;
  long lVar9;
  NotSupportedError *this_01;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  size_t __n;
  pointer pSVar13;
  int local_f8 [2];
  string local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  iVar4 = (*((this->super_RenderPerformanceTestBase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var,iVar4);
  RenderPerformanceTestBase::init(&this->super_RenderPerformanceTestBase,ctx);
  pRVar5 = Context::getRenderTarget
                     ((this->super_RenderPerformanceTestBase).super_TestCase.m_context);
  if (0x7f < pRVar5->m_width) {
    pRVar5 = Context::getRenderTarget
                       ((this->super_RenderPerformanceTestBase).super_TestCase.m_context);
    if (0x7f < pRVar5->m_height) {
      lVar11 = 0;
      (**(code **)(lVar9 + 0x1a00))(0,0,0x80,0x80);
      (**(code **)(lVar9 + 0x120))(0x302,0x303);
      (**(code **)(lVar9 + 0x100))(0x8006);
      (**(code **)(lVar9 + 0x5e0))(0xbe2);
      do {
        if (lVar11 == 0x4c) {
          std::vector<int,_std::allocator<int>_>::resize
                    (&this->m_iterationOrder,
                     ((long)(this->m_results).
                            super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>::SampleResult>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->m_results).
                           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>::SampleResult>_>
                           ._M_impl.super__Vector_impl_data._M_start) / 0x58);
          generateTwoPassRandomIterationOrder
                    (&this->m_iterationOrder,
                     (int)((ulong)((long)(this->m_iterationOrder).
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_finish -
                                  (long)(this->m_iterationOrder).
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_start) >> 2));
          return extraout_EAX;
        }
        pSVar8 = (this->m_results).
                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>::SampleResult>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pSVar8 == (this->m_results).
                      super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>::SampleResult>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          this_00 = (this->m_results).
                    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>::SampleResult>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          __n = (long)pSVar8 - (long)this_00;
          if (__n == 0x7ffffffffffffff8) {
            std::__throw_length_error("vector::_M_realloc_insert");
          }
          uVar6 = (long)__n / 0x58;
          uVar7 = uVar6;
          if (pSVar8 == this_00) {
            uVar7 = 1;
          }
          uVar10 = uVar7 + uVar6;
          if (0x1745d1745d1745c < uVar10) {
            uVar10 = 0x1745d1745d1745d;
          }
          uVar12 = 0x1745d1745d1745d;
          if (!CARRY8(uVar7,uVar6)) {
            uVar12 = uVar10;
          }
          if (uVar12 == 0) {
            pSVar8 = (pointer)0x0;
          }
          else {
            pSVar8 = (pointer)operator_new(uVar12 * 0x58);
          }
          pdVar1 = &pSVar8[uVar6].result.duration.totalDuration;
          *pdVar1 = 0;
          pdVar1[1] = 0;
          pdVar1 = &pSVar8[uVar6].result.duration.secondRenderDuration;
          *pdVar1 = 0;
          pdVar1[1] = 0;
          pRVar2 = &pSVar8[uVar6].result.duration;
          pRVar2->firstRenderDuration = 0;
          pRVar2->uploadDuration = 0;
          pRVar3 = &pSVar8[uVar6].result;
          pRVar3->uploadedDataSize = 0;
          pRVar3->renderDataSize = 0;
          pRVar3->unrelatedDataSize = 0;
          pRVar3->numVertices = 0;
          pSVar13 = pSVar8 + uVar6;
          (pSVar13->scene).gridWidth = 0;
          (pSVar13->scene).gridHeight = 0;
          *(undefined8 *)&(pSVar13->scene).gridLayers = 0;
          pSVar8[uVar6].result.duration.fitResponseDuration = 0;
          if (0 < (long)__n) {
            memmove(pSVar8,this_00,__n);
          }
          pSVar13 = (pointer)((long)pSVar8 + __n + 0x58);
          lVar9 = (long)(this->m_results).
                        super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>::SampleResult>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)this_00;
          std::
          _Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>::SampleResult>_>
          ::_M_deallocate((_Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>::SampleResult>_>
                           *)this_00,(pointer)(lVar9 / 0x58),lVar9 % 0x58);
          (this->m_results).
          super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>::SampleResult>_>
          ._M_impl.super__Vector_impl_data._M_start = pSVar8;
          (this->m_results).
          super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>::SampleResult>_>
          ._M_impl.super__Vector_impl_data._M_finish = pSVar13;
          (this->m_results).
          super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>::SampleResult>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = pSVar8 + uVar12;
        }
        else {
          (pSVar8->result).duration.totalDuration = 0;
          (pSVar8->result).duration.renderReadDuration = 0;
          (pSVar8->result).duration.secondRenderDuration = 0;
          (pSVar8->result).duration.readDuration = 0;
          (pSVar8->result).duration.firstRenderDuration = 0;
          (pSVar8->result).duration.uploadDuration = 0;
          *(pointer *)&pSVar8->result = (pointer)0x0;
          (pSVar8->result).unrelatedDataSize = 0;
          (pSVar8->result).numVertices = 0;
          (pSVar8->result).duration.fitResponseDuration = 0;
          (((_Vector_impl *)&pSVar8->scene)->super__Vector_impl_data)._M_start = (pointer)0x0;
          (((_Vector_impl *)&pSVar8->scene)->super__Vector_impl_data)._M_finish = (pointer)0x0;
          pSVar13 = (this->m_results).
                    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>::SampleResult>_>
                    ._M_impl.super__Vector_impl_data._M_finish + 1;
          (this->m_results).
          super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>::SampleResult>_>
          ._M_impl.super__Vector_impl_data._M_finish = pSVar13;
        }
        iVar4 = *(int *)((long)&DAT_01877760 + lVar11);
        pSVar13[-1].scene.gridHeight = iVar4;
        pSVar13[-1].scene.gridWidth = iVar4;
        pSVar13[-1].scene.gridLayers = 5;
        pSVar13[-1].result.numVertices = iVar4 * iVar4 * 0x1e;
        pSVar13[-1].result.uploadedDataSize = -1;
        pSVar13[-1].result.renderDataSize = -1;
        pSVar13[-1].result.unrelatedDataSize = -1;
        lVar11 = lVar11 + 4;
      } while( true );
    }
  }
  this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  local_f8[1] = 0x80;
  de::toString<int>(&local_d0,local_f8 + 1);
  std::operator+(&local_b0,"Test case requires ",&local_d0);
  std::operator+(&local_90,&local_b0,"x");
  local_f8[0] = 0x80;
  de::toString<int>(&local_f0,local_f8);
  std::operator+(&local_70,&local_90,&local_f0);
  std::operator+(&local_50,&local_70," render target");
  tcu::NotSupportedError::NotSupportedError(this_01,&local_50);
  __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void RenderCase<SampleType>::init (void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	RenderPerformanceTestBase::init();

	// requirements

	if (m_context.getRenderTarget().getWidth() < RENDER_AREA_SIZE ||
		m_context.getRenderTarget().getHeight() < RENDER_AREA_SIZE)
		throw tcu::NotSupportedError("Test case requires " + de::toString<int>(RENDER_AREA_SIZE) + "x" + de::toString<int>(RENDER_AREA_SIZE) + " render target");

	// gl state

	gl.viewport(0, 0, RENDER_AREA_SIZE, RENDER_AREA_SIZE);

	// enable bleding to prevent grid layers from being discarded
	gl.blendFunc(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA);
	gl.blendEquation(GL_FUNC_ADD);
	gl.enable(GL_BLEND);

	// generate iterations

	{
		const int gridSizes[] = { 20, 26, 32, 38, 44, 50, 56, 62, 68, 74, 80,  86,  92,  98,  104, 110, 116, 122, 128 };

		for (int gridNdx = 0; gridNdx < DE_LENGTH_OF_ARRAY(gridSizes); ++gridNdx)
		{
			m_results.push_back(SampleResult());

			m_results.back().scene.gridHeight = gridSizes[gridNdx];
			m_results.back().scene.gridWidth = gridSizes[gridNdx];
			m_results.back().scene.gridLayers = 5;

			m_results.back().result.numVertices = getLayeredGridNumVertices(m_results.back().scene);

			// test cases set these, initialize to dummy values
			m_results.back().result.renderDataSize = -1;
			m_results.back().result.uploadedDataSize = -1;
			m_results.back().result.unrelatedDataSize = -1;
		}
	}

	// randomize iteration order
	{
		m_iterationOrder.resize(m_results.size());
		generateTwoPassRandomIterationOrder(m_iterationOrder, (int)m_iterationOrder.size());
	}
}